

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zello_log.h
# Opt level: O0

string * to_string_abi_cxx11_(ze_device_compute_properties_t val)

{
  ostream *poVar1;
  string *in_RDI;
  string local_3d0 [32];
  string local_3b0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_390 [32];
  __cxx11 local_370 [32];
  uint32_t *local_350;
  uint32_t *entry;
  uint32_t *__end1;
  uint32_t *__begin1;
  uint32_t (*__range1) [8];
  string tmp;
  __cxx11 local_310 [32];
  __cxx11 local_2f0 [32];
  __cxx11 local_2d0 [32];
  __cxx11 local_2b0 [32];
  __cxx11 local_290 [32];
  __cxx11 local_270 [32];
  __cxx11 local_250 [32];
  __cxx11 local_230 [32];
  __cxx11 local_210 [32];
  string local_1f0 [32];
  stringstream local_1d0 [8];
  stringstream ss;
  ostream local_1c0 [376];
  string local_48 [55];
  undefined1 local_11;
  string *str;
  
  local_11 = 0;
  std::__cxx11::string::string(in_RDI);
  std::__cxx11::string::operator+=(in_RDI,"stype : ");
  to_string_abi_cxx11_((ze_structure_type_t)local_48);
  std::__cxx11::string::operator+=(in_RDI,local_48);
  std::__cxx11::string::~string(local_48);
  std::__cxx11::string::operator+=(in_RDI,"\n");
  std::__cxx11::string::operator+=(in_RDI,"pNext : ");
  std::__cxx11::stringstream::stringstream(local_1d0);
  poVar1 = std::operator<<(local_1c0,"0x");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::hex);
  std::ostream::operator<<(poVar1,val._0_8_);
  std::__cxx11::stringstream::str();
  std::__cxx11::string::operator+=(in_RDI,local_1f0);
  std::__cxx11::string::~string(local_1f0);
  std::__cxx11::stringstream::~stringstream(local_1d0);
  std::__cxx11::string::operator+=(in_RDI,"\n");
  std::__cxx11::string::operator+=(in_RDI,"maxTotalGroupSize : ");
  std::__cxx11::to_string(local_210,(uint)val.pNext);
  std::__cxx11::string::operator+=(in_RDI,(string *)local_210);
  std::__cxx11::string::~string((string *)local_210);
  std::__cxx11::string::operator+=(in_RDI,"\n");
  std::__cxx11::string::operator+=(in_RDI,"maxGroupSizeX : ");
  std::__cxx11::to_string(local_230,val.pNext._4_4_);
  std::__cxx11::string::operator+=(in_RDI,(string *)local_230);
  std::__cxx11::string::~string((string *)local_230);
  std::__cxx11::string::operator+=(in_RDI,"\n");
  std::__cxx11::string::operator+=(in_RDI,"maxGroupSizeY : ");
  std::__cxx11::to_string(local_250,val.maxTotalGroupSize);
  std::__cxx11::string::operator+=(in_RDI,(string *)local_250);
  std::__cxx11::string::~string((string *)local_250);
  std::__cxx11::string::operator+=(in_RDI,"\n");
  std::__cxx11::string::operator+=(in_RDI,"maxGroupSizeZ : ");
  std::__cxx11::to_string(local_270,val.maxGroupSizeX);
  std::__cxx11::string::operator+=(in_RDI,(string *)local_270);
  std::__cxx11::string::~string((string *)local_270);
  std::__cxx11::string::operator+=(in_RDI,"\n");
  std::__cxx11::string::operator+=(in_RDI,"maxGroupCountX : ");
  std::__cxx11::to_string(local_290,val.maxGroupSizeY);
  std::__cxx11::string::operator+=(in_RDI,(string *)local_290);
  std::__cxx11::string::~string((string *)local_290);
  std::__cxx11::string::operator+=(in_RDI,"\n");
  std::__cxx11::string::operator+=(in_RDI,"maxGroupCountY : ");
  std::__cxx11::to_string(local_2b0,val.maxGroupSizeZ);
  std::__cxx11::string::operator+=(in_RDI,(string *)local_2b0);
  std::__cxx11::string::~string((string *)local_2b0);
  std::__cxx11::string::operator+=(in_RDI,"\n");
  std::__cxx11::string::operator+=(in_RDI,"maxGroupCountZ : ");
  std::__cxx11::to_string(local_2d0,val.maxGroupCountX);
  std::__cxx11::string::operator+=(in_RDI,(string *)local_2d0);
  std::__cxx11::string::~string((string *)local_2d0);
  std::__cxx11::string::operator+=(in_RDI,"\n");
  std::__cxx11::string::operator+=(in_RDI,"maxSharedLocalMemory : ");
  std::__cxx11::to_string(local_2f0,val.maxGroupCountY);
  std::__cxx11::string::operator+=(in_RDI,(string *)local_2f0);
  std::__cxx11::string::~string((string *)local_2f0);
  std::__cxx11::string::operator+=(in_RDI,"\n");
  std::__cxx11::string::operator+=(in_RDI,"numSubGroupSizes : ");
  std::__cxx11::to_string(local_310,val.maxGroupCountZ);
  std::__cxx11::string::operator+=(in_RDI,(string *)local_310);
  std::__cxx11::string::~string((string *)local_310);
  std::__cxx11::string::operator+=(in_RDI,"\n");
  std::__cxx11::string::operator+=(in_RDI,"subGroupSizes : ");
  std::__cxx11::string::string((string *)&__range1);
  entry = val.subGroupSizes + 6;
  __end1 = &val.maxSharedLocalMemory;
  __begin1 = __end1;
  for (; __end1 != entry; __end1 = __end1 + 1) {
    local_350 = __end1;
    std::__cxx11::to_string(local_370,*__end1);
    std::__cxx11::string::operator+=((string *)&__range1,(string *)local_370);
    std::__cxx11::string::~string((string *)local_370);
    std::__cxx11::string::operator+=((string *)&__range1,", ");
  }
  std::__cxx11::string::size();
  std::__cxx11::string::substr((ulong)local_3d0,(ulong)&__range1);
  std::operator+((char *)local_3b0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"[ ");
  std::operator+(local_390,(char *)local_3b0);
  std::__cxx11::string::operator+=(in_RDI,(string *)local_390);
  std::__cxx11::string::~string((string *)local_390);
  std::__cxx11::string::~string(local_3b0);
  std::__cxx11::string::~string(local_3d0);
  std::__cxx11::string::~string((string *)&__range1);
  std::__cxx11::string::operator+=(in_RDI,"\n");
  return in_RDI;
}

Assistant:

std::string to_string( const ze_device_compute_properties_t val )
{
    std::string str;
    
    str += "stype : ";
    str += to_string(val.stype);
    str += "\n";
    
    str += "pNext : ";
    {
        std::stringstream ss;
        ss << "0x" << std::hex << reinterpret_cast<size_t>(val.pNext);
        str += ss.str();
    }
    str += "\n";
    
    str += "maxTotalGroupSize : ";
    str += std::to_string(val.maxTotalGroupSize);
    str += "\n";
    
    str += "maxGroupSizeX : ";
    str += std::to_string(val.maxGroupSizeX);
    str += "\n";
    
    str += "maxGroupSizeY : ";
    str += std::to_string(val.maxGroupSizeY);
    str += "\n";
    
    str += "maxGroupSizeZ : ";
    str += std::to_string(val.maxGroupSizeZ);
    str += "\n";
    
    str += "maxGroupCountX : ";
    str += std::to_string(val.maxGroupCountX);
    str += "\n";
    
    str += "maxGroupCountY : ";
    str += std::to_string(val.maxGroupCountY);
    str += "\n";
    
    str += "maxGroupCountZ : ";
    str += std::to_string(val.maxGroupCountZ);
    str += "\n";
    
    str += "maxSharedLocalMemory : ";
    str += std::to_string(val.maxSharedLocalMemory);
    str += "\n";
    
    str += "numSubGroupSizes : ";
    str += std::to_string(val.numSubGroupSizes);
    str += "\n";
    
    str += "subGroupSizes : ";
    {
        std::string tmp;
        for( auto& entry : val.subGroupSizes )
        {
            tmp += std::to_string( entry );
            tmp += ", ";
        }
        str += "[ " + tmp.substr( 0, tmp.size() - 2 ) + " ]";;
    }
    str += "\n";

    return str;
}